

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::base_widget::auto_generate(base_widget *this,form_context *context)

{
  long lVar1;
  long *in_RDI;
  iterator e;
  iterator p;
  int i;
  form *top;
  base_widget *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  form_context *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  base_widget *in_stack_ffffffffffffff50;
  long *local_18;
  
  if ((*(uint *)(in_RDI + 0x3e) >> 4 & 1) == 0) {
    lVar1 = (**(code **)(*in_RDI + 0x28))();
    if (lVar1 == 0) {
      generate(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
    }
    else {
      local_18 = (long *)(**(code **)(*in_RDI + 0x28))();
      while (lVar1 = (**(code **)(*local_18 + 0x28))(), lVar1 != 0) {
        local_18 = (long *)(**(code **)(*local_18 + 0x28))();
      }
      form::begin((form *)in_stack_fffffffffffffee8);
      form::end((form *)in_stack_fffffffffffffee8);
      while (in_stack_fffffffffffffef7 =
                  form::iterator::operator!=
                            ((iterator *)
                             CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                             (iterator *)in_stack_fffffffffffffee8), (bool)in_stack_fffffffffffffef7
            ) {
        in_stack_fffffffffffffee8 = form::iterator::operator->((iterator *)0x3f666d);
        generate(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40);
        form::iterator::operator++
                  ((iterator *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      }
      form::iterator::~iterator
                ((iterator *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      form::iterator::~iterator
                ((iterator *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    }
  }
  return;
}

Assistant:

void base_widget::auto_generate(form_context *context)
{
	if(is_generation_done_)
		return;
	if(parent() == 0) {
		generate(1,context);
		return;
	}
	form *top;
	for(top = parent();top->parent();top=top->parent())
		;
	int i=1;
	form::iterator p=top->begin(),e=top->end();
	while(p!=e) {
		p->generate(i,context);
		++p;
		++i;
	}
}